

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int defragmentPage(MemPage *pPage,int nMaxFrag)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  u8 *puVar4;
  char *pcVar5;
  bool bVar6;
  ushort uVar7;
  u16 uVar8;
  ushort uVar9;
  ushort uVar10;
  uint uVar11;
  ushort uVar12;
  uint uVar13;
  undefined8 uVar14;
  ushort *puVar15;
  ulong uVar16;
  uint unaff_EBP;
  short sVar17;
  uint uVar18;
  ulong uVar19;
  int iVar20;
  uint uVar21;
  u8 *__src;
  uint uVar22;
  
  puVar4 = pPage->aData;
  uVar19 = (ulong)pPage->hdrOffset;
  uVar1 = pPage->cellOffset;
  uVar2 = pPage->nCell;
  uVar13 = (uint)uVar1 + (uint)uVar2 * 2;
  uVar3 = pPage->pBt->usableSize;
  if ((int)(uint)puVar4[uVar19 + 7] <= nMaxFrag) {
    uVar7 = *(ushort *)(puVar4 + uVar19 + 1) << 8 | *(ushort *)(puVar4 + uVar19 + 1) >> 8;
    uVar14 = 0x10fe6;
    if ((int)(uVar3 - 4) < (int)(uint)uVar7) {
LAB_0016885f:
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar14,
                  "89c459e766ea7e9165d0beeb124708b955a4950d0f4792f457465d71b158d318");
      iVar20 = 1;
    }
    else {
      uVar21 = (uint)uVar7;
      iVar20 = 0;
      if (uVar7 != 0) {
        uVar12 = *(ushort *)(puVar4 + uVar7) << 8 | *(ushort *)(puVar4 + uVar7) >> 8;
        uVar14 = 0x10fe9;
        if ((int)(uint)uVar12 <= (int)(uVar3 - 4)) {
          uVar22 = (uint)uVar12;
          if ((uVar12 != 0) &&
             ((iVar20 = 0, puVar4[uVar12] != '\0' || (puVar4[(ulong)uVar12 + 1] != '\0'))))
          goto LAB_00168888;
          uVar9 = *(ushort *)(puVar4 + uVar19 + 5) << 8 | *(ushort *)(puVar4 + uVar19 + 5) >> 8;
          uVar14 = 0x10ff1;
          iVar20 = uVar21 - uVar9;
          if (uVar9 <= uVar21 && iVar20 != 0) {
            uVar10 = *(ushort *)(puVar4 + (ulong)uVar7 + 2) << 8 |
                     *(ushort *)(puVar4 + (ulong)uVar7 + 2) >> 8;
            uVar18 = (uint)uVar10;
            uVar11 = (uint)uVar10 + (uint)uVar7;
            if (uVar22 == 0) {
              unaff_EBP = 0;
              uVar14 = 0x10ffa;
              uVar22 = unaff_EBP;
              if ((int)uVar11 <= (int)uVar3) {
LAB_00168b24:
                unaff_EBP = uVar18 + uVar9;
                memmove(puVar4 + unaff_EBP,puVar4 + uVar9,(long)iVar20);
                iVar20 = 5;
                if (uVar1 < uVar13) {
                  puVar15 = (ushort *)(puVar4 + uVar1);
                  do {
                    uVar7 = *puVar15 << 8 | *puVar15 >> 8;
                    sVar17 = (short)uVar18;
                    if ((uVar7 < uVar21) || (sVar17 = (short)uVar22, (uint)uVar7 < (uint)uVar12)) {
                      *puVar15 = (uVar7 + sVar17) * 0x100 | (ushort)(uVar7 + sVar17) >> 8;
                    }
                    puVar15 = puVar15 + 1;
                    iVar20 = 5;
                  } while (puVar15 < puVar4 + uVar13);
                }
                goto LAB_00168888;
              }
            }
            else {
              uVar14 = 0x10ff4;
              if (uVar11 <= uVar22) {
                uVar7 = *(ushort *)(puVar4 + (ulong)uVar12 + 2) << 8 |
                        *(ushort *)(puVar4 + (ulong)uVar12 + 2) >> 8;
                unaff_EBP = (uint)uVar7;
                uVar14 = 0x10ff6;
                if ((int)((uint)uVar12 + (uint)uVar7) <= (int)uVar3) {
                  memmove(puVar4 + (uVar11 + uVar7),puVar4 + uVar11,(long)(int)(uVar22 - uVar11));
                  uVar18 = (uint)uVar10 + (uint)uVar7;
                  uVar22 = unaff_EBP;
                  goto LAB_00168b24;
                }
              }
            }
          }
        }
        goto LAB_0016885f;
      }
    }
LAB_00168888:
    if (iVar20 == 5) goto LAB_001689d7;
    if (iVar20 != 0) {
      return 0xb;
    }
  }
  unaff_EBP = uVar3;
  if ((ulong)uVar2 != 0) {
    uVar7 = *(ushort *)(puVar4 + uVar19 + 5) << 8 | *(ushort *)(puVar4 + uVar19 + 5) >> 8;
    pcVar5 = pPage->pBt->pPager->pTmpSpace;
    memcpy(pcVar5 + uVar7,puVar4 + uVar7,(long)(int)(uVar3 - uVar7));
    uVar16 = 0;
    do {
      uVar12 = *(ushort *)(puVar4 + uVar16 * 2 + (ulong)uVar1) << 8 |
               *(ushort *)(puVar4 + uVar16 * 2 + (ulong)uVar1) >> 8;
      if (((uint)uVar12 < (uint)uVar7) ||
         (uVar21 = (uint)uVar12, uVar21 != uVar3 - 4 && (int)(uVar3 - 4) <= (int)(uint)uVar12)) {
        uVar14 = 0x1101b;
LAB_0016899c:
        bVar6 = false;
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar14,
                    "89c459e766ea7e9165d0beeb124708b955a4950d0f4792f457465d71b158d318");
      }
      else {
        __src = (u8 *)(pcVar5 + uVar21);
        uVar8 = (*pPage->xCellSize)(pPage,__src);
        unaff_EBP = unaff_EBP - uVar8;
        if (((int)unaff_EBP < (int)(uint)uVar7) || ((int)uVar3 < (int)(uVar21 + uVar8))) {
          uVar14 = 0x11021;
          goto LAB_0016899c;
        }
        *(ushort *)(puVar4 + uVar16 * 2 + (ulong)uVar1) =
             (ushort)unaff_EBP << 8 | (ushort)unaff_EBP >> 8;
        memcpy(puVar4 + unaff_EBP,__src,(ulong)uVar8);
        bVar6 = true;
      }
      if (!bVar6) {
        return 0xb;
      }
      uVar16 = uVar16 + 1;
    } while (uVar2 != uVar16);
  }
  puVar4[uVar19 + 7] = '\0';
LAB_001689d7:
  if ((uint)puVar4[uVar19 + 7] + (unaff_EBP - uVar13) == pPage->nFree) {
    *(ushort *)(puVar4 + uVar19 + 5) = (ushort)unaff_EBP << 8 | (ushort)unaff_EBP >> 8;
    (puVar4 + uVar19 + 1)[0] = '\0';
    (puVar4 + uVar19 + 1)[1] = '\0';
    iVar20 = 0;
    memset(puVar4 + uVar13,0,(long)(int)(unaff_EBP - uVar13));
  }
  else {
    iVar20 = 0xb;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x1102f,
                "89c459e766ea7e9165d0beeb124708b955a4950d0f4792f457465d71b158d318");
  }
  return iVar20;
}

Assistant:

static int defragmentPage(MemPage *pPage, int nMaxFrag){
  int i;                     /* Loop counter */
  int pc;                    /* Address of the i-th cell */
  int hdr;                   /* Offset to the page header */
  int size;                  /* Size of a cell */
  int usableSize;            /* Number of usable bytes on a page */
  int cellOffset;            /* Offset to the cell pointer array */
  int cbrk;                  /* Offset to the cell content area */
  int nCell;                 /* Number of cells on the page */
  unsigned char *data;       /* The page data */
  unsigned char *temp;       /* Temp area for cell content */
  unsigned char *src;        /* Source of content */
  int iCellFirst;            /* First allowable cell index */
  int iCellLast;             /* Last possible cell index */
  int iCellStart;            /* First cell offset in input */

  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( pPage->pBt!=0 );
  assert( pPage->pBt->usableSize <= SQLITE_MAX_PAGE_SIZE );
  assert( pPage->nOverflow==0 );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  data = pPage->aData;
  hdr = pPage->hdrOffset;
  cellOffset = pPage->cellOffset;
  nCell = pPage->nCell;
  assert( nCell==get2byte(&data[hdr+3]) || CORRUPT_DB );
  iCellFirst = cellOffset + 2*nCell;
  usableSize = pPage->pBt->usableSize;

  /* This block handles pages with two or fewer free blocks and nMaxFrag
  ** or fewer fragmented bytes. In this case it is faster to move the
  ** two (or one) blocks of cells using memmove() and add the required
  ** offsets to each pointer in the cell-pointer array than it is to
  ** reconstruct the entire page.  */
  if( (int)data[hdr+7]<=nMaxFrag ){
    int iFree = get2byte(&data[hdr+1]);
    if( iFree>usableSize-4 ) return SQLITE_CORRUPT_PAGE(pPage);
    if( iFree ){
      int iFree2 = get2byte(&data[iFree]);
      if( iFree2>usableSize-4 ) return SQLITE_CORRUPT_PAGE(pPage);
      if( 0==iFree2 || (data[iFree2]==0 && data[iFree2+1]==0) ){
        u8 *pEnd = &data[cellOffset + nCell*2];
        u8 *pAddr;
        int sz2 = 0;
        int sz = get2byte(&data[iFree+2]);
        int top = get2byte(&data[hdr+5]);
        if( top>=iFree ){
          return SQLITE_CORRUPT_PAGE(pPage);
        }
        if( iFree2 ){
          if( iFree+sz>iFree2 ) return SQLITE_CORRUPT_PAGE(pPage);
          sz2 = get2byte(&data[iFree2+2]);
          if( iFree2+sz2 > usableSize ) return SQLITE_CORRUPT_PAGE(pPage);
          memmove(&data[iFree+sz+sz2], &data[iFree+sz], iFree2-(iFree+sz));
          sz += sz2;
        }else if( iFree+sz>usableSize ){
          return SQLITE_CORRUPT_PAGE(pPage);
        }

        cbrk = top+sz;
        assert( cbrk+(iFree-top) <= usableSize );
        memmove(&data[cbrk], &data[top], iFree-top);
        for(pAddr=&data[cellOffset]; pAddr<pEnd; pAddr+=2){
          pc = get2byte(pAddr);
          if( pc<iFree ){ put2byte(pAddr, pc+sz); }
          else if( pc<iFree2 ){ put2byte(pAddr, pc+sz2); }
        }
        goto defragment_out;
      }
    }
  }

  cbrk = usableSize;
  iCellLast = usableSize - 4;
  iCellStart = get2byte(&data[hdr+5]);
  if( nCell>0 ){
    temp = sqlite3PagerTempSpace(pPage->pBt->pPager);
    memcpy(&temp[iCellStart], &data[iCellStart], usableSize - iCellStart);
    src = temp;
    for(i=0; i<nCell; i++){
      u8 *pAddr;     /* The i-th cell pointer */
      pAddr = &data[cellOffset + i*2];
      pc = get2byte(pAddr);
      testcase( pc==iCellFirst );
      testcase( pc==iCellLast );
      /* These conditions have already been verified in btreeInitPage()
      ** if PRAGMA cell_size_check=ON.
      */
      if( pc<iCellStart || pc>iCellLast ){
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      assert( pc>=iCellStart && pc<=iCellLast );
      size = pPage->xCellSize(pPage, &src[pc]);
      cbrk -= size;
      if( cbrk<iCellStart || pc+size>usableSize ){
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      assert( cbrk+size<=usableSize && cbrk>=iCellStart );
      testcase( cbrk+size==usableSize );
      testcase( pc+size==usableSize );
      put2byte(pAddr, cbrk);
      memcpy(&data[cbrk], &src[pc], size);
    }
  }
  data[hdr+7] = 0;

defragment_out:
  assert( pPage->nFree>=0 );
  if( data[hdr+7]+cbrk-iCellFirst!=pPage->nFree ){
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  assert( cbrk>=iCellFirst );
  put2byte(&data[hdr+5], cbrk);
  data[hdr+1] = 0;
  data[hdr+2] = 0;
  memset(&data[iCellFirst], 0, cbrk-iCellFirst);
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  return SQLITE_OK;
}